

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O0

void __thiscall
Atari2600::TIA::draw_missile
          (TIA *this,Missile *missile,Player *player,uint8_t collision_identity,int start,int end)

{
  int end_local;
  int start_local;
  uint8_t collision_identity_local;
  Player *player_local;
  Missile *missile_local;
  TIA *this_local;
  
  if ((((missile->super_HorizontalRun).field_0x1e & 1) == 0) || (player->latched_pixel4_time < 0)) {
    draw_object<Atari2600::TIA::Missile>(this,missile,collision_identity,start,end);
  }
  else {
    draw_object<Atari2600::TIA::Missile>
              (this,missile,collision_identity,start,player->latched_pixel4_time);
    (missile->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position = 0;
    draw_object<Atari2600::TIA::Missile>
              (this,missile,collision_identity,player->latched_pixel4_time,end);
    player->latched_pixel4_time = -1;
  }
  return;
}

Assistant:

void TIA::draw_missile(Missile &missile, Player &player, const uint8_t collision_identity, int start, int end) {
	if(!missile.locked_to_player || player.latched_pixel4_time < 0) {
		draw_object<Missile>(missile, collision_identity, start, end);
	} else {
		draw_object<Missile>(missile, collision_identity, start, player.latched_pixel4_time);
		missile.position = 0;
		draw_object<Missile>(missile, collision_identity, player.latched_pixel4_time, end);
		player.latched_pixel4_time = -1;
	}
}